

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall
ktx::ValidationContext::fatal<std::__cxx11::string_const&,std::__cxx11::string>
          (ValidationContext *this,IssueFatal *issue,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  FatalValidationError *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args_00;
  allocator<char> local_e9;
  ValidationReport report;
  ValidationReport local_a0;
  pointer local_58;
  size_type sStack_50;
  pointer local_48;
  size_type sStack_40;
  
  this->numError = this->numError + 1;
  this->returnCode = 3;
  report.type = (issue->super_Issue).type;
  report.id = (issue->super_Issue).id;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&report.message,&(issue->super_Issue).message,&local_e9);
  local_58 = (args->_M_dataplus)._M_p;
  sStack_50 = args->_M_string_length;
  local_48 = (args_1->_M_dataplus)._M_p;
  sStack_40 = args_1->_M_string_length;
  fmt.size_ = 0xdd;
  fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
  args_00.field_1.args_ = in_R9.args_;
  args_00.desc_ = (unsigned_long_long)&local_58;
  ::fmt::v10::vformat_abi_cxx11_
            (&report.details,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args_00);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()(&this->callback,&report);
  this_00 = (FatalValidationError *)__cxa_allocate_exception(0x58);
  ValidationReport::ValidationReport(&local_a0,&report);
  FatalValidationError::FatalValidationError(this_00,&local_a0);
  __cxa_throw(this_00,&FatalValidationError::typeinfo,FatalValidationError::~FatalValidationError);
}

Assistant:

void fatal(const IssueFatal& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        const auto report = ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)};
        callback(report);

        throw FatalValidationError(report);
    }